

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmhttpreq.cpp
# Opt level: O3

int __thiscall
CVmObjHTTPRequest::getp_getQuery
          (CVmObjHTTPRequest *this,vm_obj_id_t self,vm_val_t *retval,uint *oargc)

{
  int iVar1;
  
  if (getp_getQuery(unsigned_int,vm_val_t*,unsigned_int*)::desc == '\0') {
    getp_getQuery();
  }
  iVar1 = CVmObject::get_prop_check_argc(retval,oargc,&getp_getQuery::desc);
  if (iVar1 == 0) {
    new_ascii_string(retval,*(char **)(*(long *)(*(long *)(this->super_CVmObject).ext_ + 0x48) +
                                      0x10));
  }
  return 1;
}

Assistant:

int CVmObjHTTPRequest::getp_getQuery(VMG_ vm_obj_id_t self,
                                     vm_val_t *retval, uint *oargc)
{
    static CVmNativeCodeDesc desc(0);
    if (get_prop_check_argc(retval, oargc, &desc))
        return TRUE;

    /* create a validated ASCII string for the query string */
    new_ascii_string(vmg_ retval, get_ext()->req->resource_name->get());

    /* handled */
    return TRUE;
}